

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_select(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  uint64_t i;
  uint64_t uVar2;
  unsigned_long b;
  uint64_t element;
  
  r = roaring64_bitmap_create();
  for (uVar2 = 0; uVar2 != 100000; uVar2 = uVar2 + 1000) {
    roaring64_bitmap_add(r,uVar2);
  }
  element = 0;
  b = 0;
  for (uVar2 = 0; uVar2 != 100; uVar2 = uVar2 + 1) {
    _Var1 = roaring64_bitmap_select(r,uVar2,&element);
    _assert_true((ulong)_Var1,"roaring64_bitmap_select(r, i, &element)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                 ,0x225);
    _assert_int_equal(element,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                      ,0x226);
    b = b + 1000;
  }
  _Var1 = roaring64_bitmap_select(r,100,&element);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_select(r, 100, &element)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x228);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_select) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    for (uint64_t i = 0; i < 100; ++i) {
        roaring64_bitmap_add(r, i * 1000);
    }
    uint64_t element = 0;
    for (uint64_t i = 0; i < 100; ++i) {
        assert_true(roaring64_bitmap_select(r, i, &element));
        assert_int_equal(element, i * 1000);
    }
    assert_false(roaring64_bitmap_select(r, 100, &element));
    roaring64_bitmap_free(r);
}